

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

pcp_flow_event_e fhndl_received_success(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  byte bVar1;
  undefined8 uVar2;
  long lVar3;
  timeval ctv;
  
  lVar3 = msg->received_time + (ulong)msg->recv_lifetime;
  if (0x7fffffffffffffffU - msg->received_time < (ulong)msg->recv_lifetime) {
    lVar3 = 0x7fffffffffffffff;
  }
  f->recv_lifetime = lVar3;
  bVar1 = (f->kd).operation;
  if (bVar1 - 1 < 2) {
    uVar2 = *(undefined8 *)((long)&(msg->assigned_ext_ip).__in6_u + 8);
    *(undefined8 *)&f->field_5 = *(undefined8 *)&(msg->assigned_ext_ip).__in6_u;
    *(undefined8 *)((long)&f->field_5 + 8) = uVar2;
    (f->field_5).map_peer.ext_port = msg->assigned_ext_port;
  }
  else if (bVar1 == 3) {
    (f->field_5).sadscp.learned_dscp = msg->recv_dscp;
  }
  f->recv_result = msg->recv_result;
  gettimeofday((timeval *)&ctv,(__timezone_ptr_t)0x0);
  if (msg->recv_lifetime == 0) {
    (f->timeout).tv_sec = 0;
    (f->timeout).tv_usec = 0;
  }
  else {
    (f->timeout).tv_sec = ctv.tv_sec;
    (f->timeout).tv_usec = ctv.tv_usec;
    (f->timeout).tv_sec = (f->timeout).tv_sec + (f->recv_lifetime - ctv.tv_sec >> 1);
  }
  return fev_none;
}

Assistant:

static pcp_flow_event_e fhndl_received_success(pcp_flow_t *f,
                                               pcp_recv_msg_t *msg) {
    struct timeval ctv;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);
    // avoid integer overflow
    if (msg->recv_lifetime > (time_t)LONG_MAX - msg->received_time) {
        f->recv_lifetime = LONG_MAX;
    } else {
        f->recv_lifetime = msg->received_time + msg->recv_lifetime;
    }
    if ((f->kd.operation == PCP_OPCODE_MAP) ||
        (f->kd.operation == PCP_OPCODE_PEER)) {
        f->map_peer.ext_ip = msg->assigned_ext_ip;
        f->map_peer.ext_port = msg->assigned_ext_port;
#ifdef PCP_SADSCP
    } else if (f->kd.operation == PCP_OPCODE_SADSCP) {
        f->sadscp.learned_dscp = msg->recv_dscp;
#endif
    }
    f->recv_result = msg->recv_result;

    gettimeofday(&ctv, NULL);

    if (msg->recv_lifetime == 0) {
        f->timeout.tv_sec = 0;
        f->timeout.tv_usec = 0;
    } else {
        f->timeout = ctv;
        f->timeout.tv_sec += (long int)((f->recv_lifetime - ctv.tv_sec) >> 1);
    }

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return fev_none;
}